

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O0

void __thiscall
Outputs::Display::BufferingScanTarget::set_modals(BufferingScanTarget *this,Modals modals)

{
  anon_class_80_2_49262b61 local_80;
  function<void_()> local_30;
  BufferingScanTarget *local_10;
  BufferingScanTarget *this_local;
  
  local_80.modals.aspect_ratio = modals.aspect_ratio;
  local_80.modals.visible_area.size.height = modals.visible_area.size.height;
  local_80.modals.intended_gamma = modals.intended_gamma;
  local_80.modals.brightness = modals.brightness;
  local_80.modals.output_scale = modals.output_scale;
  local_80.modals.expected_vertical_lines = modals.expected_vertical_lines;
  local_80.modals.visible_area.origin.x = modals.visible_area.origin.x;
  local_80.modals.visible_area.origin.y = modals.visible_area.origin.y;
  local_80.modals.visible_area.size.width = modals.visible_area.size.width;
  local_80.modals.cycles_per_line = modals.cycles_per_line;
  local_80.modals.clocks_per_pixel_greatest_common_divisor =
       modals.clocks_per_pixel_greatest_common_divisor;
  local_80.modals.colour_cycle_numerator = modals.colour_cycle_numerator;
  local_80.modals.colour_cycle_denominator = modals.colour_cycle_denominator;
  local_80.modals.input_data_type = modals.input_data_type;
  local_80.modals.input_data_tweaks.phase_linked_luminance_offset =
       modals.input_data_tweaks.phase_linked_luminance_offset;
  local_80.modals.display_type = modals.display_type;
  local_80.modals.composite_colour_space = modals.composite_colour_space;
  local_80.this = this;
  local_10 = this;
  std::function<void()>::
  function<Outputs::Display::BufferingScanTarget::set_modals(Outputs::Display::ScanTarget::Modals)::__0,void>
            ((function<void()> *)&local_30,&local_80);
  perform(this,&local_30);
  std::function<void_()>::~function(&local_30);
  return;
}

Assistant:

void BufferingScanTarget::set_modals(Modals modals) {
	perform([=] {
		modals_ = modals;
		modals_are_dirty_.store(true, std::memory_order::memory_order_relaxed);
	});
}